

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_batch_collector.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBufferedBatchCollector::GetGlobalSinkState
          (PhysicalBufferedBatchCollector *this,ClientContext *context)

{
  pointer other;
  pointer this_00;
  pointer pBVar1;
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_> in_RDI;
  templated_unique_single_t state;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff88;
  weak_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff90;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> this_01;
  enable_shared_from_this<duckdb::ClientContext> *in_stack_ffffffffffffffb8;
  
  this_01._M_head_impl =
       (GlobalSinkState *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  make_uniq<duckdb::BufferedBatchCollectorGlobalState>();
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this(in_stack_ffffffffffffffb8);
  other = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
          ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                        *)in_stack_ffffffffffffff90);
  weak_ptr<duckdb::ClientContext,_true>::operator=<duckdb::ClientContext,_0>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  shared_ptr<duckdb::ClientContext,_true>::~shared_ptr
            ((shared_ptr<duckdb::ClientContext,_true> *)0x17e245b);
  this_00 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                          *)in_stack_ffffffffffffff90);
  make_shared_ptr<duckdb::BatchedBufferedData,duckdb::weak_ptr<duckdb::ClientContext,true>&>
            (&in_stack_ffffffffffffffb8->__weak_this_);
  pBVar1 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                         *)this_00);
  shared_ptr<duckdb::BufferedData,_true>::operator=<duckdb::BatchedBufferedData,_0>
            ((shared_ptr<duckdb::BufferedData,_true> *)this_01._M_head_impl,
             (shared_ptr<duckdb::BatchedBufferedData,_true> *)other);
  shared_ptr<duckdb::BatchedBufferedData,_true>::~shared_ptr
            ((shared_ptr<duckdb::BatchedBufferedData,_true> *)0x17e24af);
  unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>,true>::
  unique_ptr<duckdb::BufferedBatchCollectorGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>>>,void>
            ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)this_00,
             (unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
              *)pBVar1);
  unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                 *)0x17e24c8);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (__uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
         .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBufferedBatchCollector::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<BufferedBatchCollectorGlobalState>();
	state->context = context.shared_from_this();
	state->buffered_data = make_shared_ptr<BatchedBufferedData>(state->context);
	return std::move(state);
}